

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AutoReg::registerTestCase
          (AutoReg *this,ITestCase *testCase,char *classOrQualifiedMethodName,
          NameAndDesc *nameAndDesc,SourceLineInfo *lineInfo)

{
  char *pcVar1;
  NameAndDesc *pNVar2;
  char *_testCase;
  IMutableRegistryHub *pIVar3;
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [55];
  allocator local_189;
  string local_188 [32];
  Catch local_168 [32];
  TestCase local_148;
  SourceLineInfo *local_30;
  SourceLineInfo *lineInfo_local;
  NameAndDesc *nameAndDesc_local;
  char *classOrQualifiedMethodName_local;
  ITestCase *testCase_local;
  AutoReg *this_local;
  
  local_30 = lineInfo;
  lineInfo_local = (SourceLineInfo *)nameAndDesc;
  nameAndDesc_local = (NameAndDesc *)classOrQualifiedMethodName;
  classOrQualifiedMethodName_local = (char *)testCase;
  testCase_local = (ITestCase *)this;
  pIVar3 = getMutableRegistryHub();
  _testCase = classOrQualifiedMethodName_local;
  pNVar2 = nameAndDesc_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,(char *)pNVar2,&local_189);
  extractClassName(local_168,(string *)local_188);
  pcVar1 = *(char **)lineInfo_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,pcVar1,&local_1c1);
  pcVar1 = *(char **)&lineInfo_local->field_0x8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,pcVar1,&local_1e9);
  makeTestCase(&local_148,(ITestCase *)_testCase,(string *)local_168,(string *)local_1c0,
               (string *)local_1e8,local_30);
  (*pIVar3->_vptr_IMutableRegistryHub[3])(pIVar3,&local_148);
  TestCase::~TestCase(&local_148);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  return;
}

Assistant:

void AutoReg::registerTestCase( ITestCase* testCase,
                                    char const* classOrQualifiedMethodName,
                                    NameAndDesc const& nameAndDesc,
                                    SourceLineInfo const& lineInfo ) {

        getMutableRegistryHub().registerTest
            ( makeTestCase( testCase,
                            extractClassName( classOrQualifiedMethodName ),
                            nameAndDesc.name,
                            nameAndDesc.description,
                            lineInfo ) );
    }